

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_trace.c
# Opt level: O0

void trace_end_(long *proc)

{
  ulong *in_RDI;
  unsigned_long k;
  unsigned_long i;
  char fname [10];
  FILE *fout;
  Integer in_stack_ffffffffffffffb8;
  unsigned_long local_40;
  ulong local_30;
  ulong local_28;
  char local_1a [10];
  FILE *local_10;
  ulong *local_8;
  
  local_8 = in_RDI;
  sprintf(local_1a,"%03d",*in_RDI & 0xffffffff);
  local_10 = fopen(local_1a,"w");
  local_28 = 0;
  while( true ) {
    if (current < MAX_EVENTS) {
      local_40 = current;
    }
    else {
      local_40 = MAX_EVENTS;
    }
    if (local_40 <= local_28) break;
    fprintf(local_10,"%d ",*local_8 & 0xffffffff);
    for (local_30 = local_28 * 6; local_30 < (local_28 + 1) * 6; local_30 = local_30 + 1) {
      fprintf(local_10,"%d ",indlog[local_30] & 0xffffffff);
    }
    fprintf(local_10,"%ld %ld\n",tlog[local_28 * 2],tlog[local_28 * 2 + 1]);
    local_28 = local_28 + 1;
  }
  MA_pop_stack(in_stack_ffffffffffffffb8);
  MA_pop_stack(in_stack_ffffffffffffffb8);
  MA_pop_stack(in_stack_ffffffffffffffb8);
  fclose(local_10);
  return;
}

Assistant:

void trace_end_(long *proc)
{
    FILE *fout;
    char fname[10];
    unsigned long i,k;
    
    sprintf(fname,"%03d",(int)*proc);
    fout=fopen(fname,"w");
    
    for(i=0;i<min(current,MAX_EVENTS);i++){
        fprintf(fout,"%d ",(int)*proc);
        for(k=i*6;k<6*(i+1);k++)fprintf(fout,"%d ",(int)indlog[k]);
        fprintf(fout,"%ld %ld\n",(unsigned long)tlog[i*2],
                (unsigned long)tlog[i*2+1]);
    }

    MA_pop_stack(gahandle);
    MA_pop_stack(ihandle);
    MA_pop_stack(thandle);
    
    fclose(fout);
}